

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::~TransformFeedbackCase
          (TransformFeedbackCase *this)

{
  TransformFeedbackCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TransformFeedbackCase_01599a40;
  deinit(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_outputBuffers);
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_bufferStrides);
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
  ::~vector(&this->m_transformFeedbackOutputs);
  std::
  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
  ::~vector(&this->m_attributes);
  ProgramSpec::~ProgramSpec(&this->m_progSpec);
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TransformFeedbackCase::~TransformFeedbackCase (void)
{
	TransformFeedbackCase::deinit();
}